

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

int __thiscall
slang::SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::copy
          (SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  size_type sVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  pointer paVar4;
  byte *pbVar5;
  byte *pbVar6;
  pointer pAVar7;
  byte *pbVar8;
  pointer pAVar9;
  byte *pbVar10;
  
  sVar1 = this->len;
  if (sVar1 == 0) {
    return 0;
  }
  pbVar5 = (byte *)(*(long *)(*(long *)dst + 8) + 7U & 0xfffffffffffffff8);
  pbVar8 = pbVar5 + sVar1 * 0x28;
  if (*(byte **)(dst + 8) < pbVar8) {
    pbVar6 = BumpAllocator::allocateSlow((BumpAllocator *)dst,sVar1 * 0x28,8);
    sVar1 = this->len;
    if (sVar1 == 0) goto LAB_003764ec;
    pAVar7 = this->data_;
    pAVar9 = pAVar7 + sVar1;
    pbVar8 = pbVar6 + sVar1 * 0x28;
    pbVar5 = pbVar6;
  }
  else {
    *(byte **)(*(long *)dst + 8) = pbVar8;
    pAVar7 = this->data_;
    pAVar9 = pAVar7 + sVar1;
    pbVar6 = pbVar5;
  }
  do {
    pbVar10 = pbVar5 + 0x28;
    *(size_t *)(pbVar5 + 0x20) = (pAVar7->edgeDescriptors)._M_extent._M_extent_value;
    pEVar2 = pAVar7->expr;
    pEVar3 = pAVar7->condition;
    paVar4 = (pAVar7->edgeDescriptors)._M_ptr;
    *(undefined8 *)(pbVar5 + 0x10) = *(undefined8 *)&pAVar7->edge;
    *(pointer *)(pbVar5 + 0x18) = paVar4;
    *(Expression **)pbVar5 = pEVar2;
    *(Expression **)(pbVar5 + 8) = pEVar3;
    if (pAVar7 + 1 == pAVar9) break;
    pAVar7 = pAVar7 + 1;
    pbVar5 = pbVar10;
  } while (pbVar10 != pbVar8);
LAB_003764ec:
  return (int)pbVar6;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }